

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field_test.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::MapFieldStateTest_MergeFromClean_Test::
~MapFieldStateTest_MergeFromClean_Test(MapFieldStateTest_MergeFromClean_Test *this)

{
  MapFieldStateTest::~MapFieldStateTest(&this->super_MapFieldStateTest);
  operator_delete(this,0x40);
  return;
}

Assistant:

TEST_P(MapFieldStateTest, MergeFromClean) {
  ArenaHolder<MapFieldType> other(arena_.get());
  AddOneStillClean(other.get());

  map_field_->MergeFrom(*other);

  if (state_ != MAP_DIRTY) {
    Expect(map_field_.get(), MAP_DIRTY, 1, 1);
  } else {
    Expect(map_field_.get(), MAP_DIRTY, 1, 0);
  }

  Expect(other.get(), CLEAN, 1, 1);
}